

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void rcpps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  _Bool _Var2;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
LAB_0011a02d:
    failDecode(pMyDisasm);
    return;
  }
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Reserved_).PrefRepe == 1) {
      (pMyDisasm->Prefix).RepPrefix = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      (pMyDisasm->Instruction).Category = 0x40002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"rcps",4);
    }
    else {
      _Var2 = prefixes_present(pMyDisasm);
      if (_Var2) goto LAB_0011a02d;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x40002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"rcpp",4);
    }
    (pMyDisasm->Instruction).Mnemonic[4] = 's';
    (pMyDisasm->Instruction).Mnemonic[5] = '\0';
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    return;
  }
  UVar1 = (pMyDisasm->Reserved_).VEX.pp;
  if (UVar1 == '\x02') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic + 3,"pss",4);
  }
  else {
    if (UVar1 != '\0') goto LAB_0011a02d;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic + 3,"pps",4);
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vrcp",4);
  vex_GxEx(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ rcpps_(PDISASM pMyDisasm)
{
 if (GV.EVEX.state == InUsePrefix) {
   failDecode(pMyDisasm);
 }
 else if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrcpps");
     #endif
     vex_GxEx(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrcpss");
     #endif
     vex_GxEx(pMyDisasm);
   }
   else {
     failDecode(pMyDisasm);
   }
 }
 else {
   /* ========== 0xf3 */
   if (GV.PrefRepe == 1) {
       pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
       GV.MemDecoration = Arg2dword;
       pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rcpss");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);

   }
   else {
     if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
       GV.MemDecoration = Arg2_m128_xmm;
       pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rcpps");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);

   }
 }
}